

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
parse_format_string<true,char,fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler,char[5]>&>
          (internal *this,basic_string_view<char> format_str,
          format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *handler)

{
  internal iVar1;
  internal *piVar2;
  internal *piVar3;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *this_00;
  char *message;
  internal *piVar4;
  internal *end;
  writer write;
  id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>_&,_char>
  local_40;
  writer local_38;
  
  this_00 = (format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *)
            format_str.size_;
  end = (internal *)(format_str.data_ + (long)this);
  local_38.handler_ = this_00;
  do {
    if (this == end) {
      return;
    }
    iVar1 = *this;
    piVar3 = this;
    piVar4 = this;
    while (piVar2 = piVar3, iVar1 != (internal)0x7b) {
      if (piVar2 == end) {
        parse_format_string<true,_char,_fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>_&>
        ::writer::operator()(&local_38,(char *)this,(char *)end);
        return;
      }
      piVar3 = piVar2 + 1;
      piVar4 = piVar2;
      iVar1 = *piVar2;
    }
    parse_format_string<true,_char,_fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>_&>
    ::writer::operator()(&local_38,(char *)this,(char *)piVar4);
    piVar4 = piVar4 + 1;
    if (piVar4 == end) {
      message = "invalid format string";
      goto LAB_0013de6d;
    }
    if (*piVar4 != (internal)0x7b) {
      if (*piVar4 == (internal)0x7d) {
        format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::on_arg_id(this_00);
      }
      else {
        local_40.handler = this_00;
        piVar4 = (internal *)
                 parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler,char[5]>&,char>>
                           ((char *)piVar4,(char *)end,&local_40);
        if (piVar4 == end) {
LAB_0013de55:
          message = "missing \'}\' in format string";
LAB_0013de6d:
          error_handler::on_error((error_handler *)&this_00->context_,message);
          return;
        }
        if (*piVar4 != (internal)0x7d) {
          if (*piVar4 != (internal)0x3a) goto LAB_0013de55;
          piVar4 = (internal *)
                   format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::
                   on_format_specs(this_00,(char *)(piVar4 + 1),(char *)end);
          if ((piVar4 == end) || (*piVar4 != (internal)0x7d)) {
            message = "unknown format specifier";
            goto LAB_0013de6d;
          }
        }
      }
    }
    this = piVar4 + 1;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}